

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O1

Box * __thiscall amrex::Geometry::growNonPeriodicDomain(Geometry *this,int ngrow)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int idim;
  long lVar5;
  Box *in_RDI;
  
  uVar2 = *(undefined8 *)(this->domain).smallend.vect;
  uVar3 = *(undefined8 *)((this->domain).smallend.vect + 2);
  uVar4 = *(undefined8 *)((this->domain).bigend.vect + 2);
  *(undefined8 *)(in_RDI->bigend).vect = *(undefined8 *)(this->domain).bigend.vect;
  *(undefined8 *)((in_RDI->bigend).vect + 2) = uVar4;
  *(undefined8 *)(in_RDI->smallend).vect = uVar2;
  *(undefined8 *)((in_RDI->smallend).vect + 2) = uVar3;
  lVar5 = 0;
  do {
    if (*(char *)((long)(this->super_CoordSys).inv_dx + lVar5 + 0x19) == '\0') {
      piVar1 = (in_RDI->smallend).vect + lVar5;
      *piVar1 = *piVar1 - ngrow;
      piVar1 = (in_RDI->bigend).vect + lVar5;
      *piVar1 = *piVar1 + ngrow;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return in_RDI;
}

Assistant:

Box
Geometry::growNonPeriodicDomain (int ngrow) const noexcept
{
    Box b = Domain();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (!isPeriodic(idim)) {
            b.grow(idim,ngrow);
        }
    }
    return b;
}